

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

bool __thiscall MlmWrap::init_hardware_connection(MlmWrap *this)

{
  void *self;
  _Bool _Var1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  zsock_t *pzVar5;
  char *pcVar6;
  undefined8 uVar7;
  ostream *poVar8;
  long in_RDI;
  lock_guard<std::mutex> lock;
  int h_port;
  string h_address;
  network_pimpl *in_stack_fffffffffffffc48;
  network_pimpl *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  allocator *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc98;
  undefined5 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce5;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  byte bVar10;
  undefined1 uVar11;
  MlmWrap *in_stack_fffffffffffffce8;
  MlmWrap *this_00;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [47];
  allocator local_271;
  string local_270 [32];
  uint local_250;
  allocator local_249;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [36];
  int local_184;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [55];
  undefined1 local_51 [33];
  string local_30 [47];
  byte local_1;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  if ((*(long *)(in_RDI + 0x58) == 0) || (_Var1 = zsock_is(*(void **)(in_RDI + 0x58)), !_Var1)) {
    network_pimpl::getHardware_endpoint_abi_cxx11_(in_stack_fffffffffffffc48);
    uVar3 = std::__cxx11::string::empty();
    bVar10 = false;
    if ((uVar3 & 1) != 0) {
      in_stack_fffffffffffffce6 =
           std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
      bVar10 = in_stack_fffffffffffffce6;
    }
    uVar11 = bVar10;
    std::__cxx11::string::~string(local_88);
    if ((bVar10 & 1) == 0) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48),
         bVar2)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_110,"Error initializing hardware connection. ",&local_111);
        error(in_stack_fffffffffffffce8,
              (string *)
              CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffce6,
                                       CONCAT15(bVar10,in_stack_fffffffffffffce0))));
        poVar8 = std::operator<<((ostream *)&std::cerr,local_f0);
        poVar8 = std::operator<<(poVar8,(string *)(in_RDI + 8));
        std::operator<<(poVar8," cannot speak to hardware!\n");
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
        local_1 = 0;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
        if (bVar2) {
          pzVar5 = zsock_new_checked(6,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
                                     ,0x4c9);
          *(zsock_t **)(in_RDI + 0x58) = pzVar5;
          if (*(long *)(in_RDI + 0x58) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_158,"Error creating hardware router socket\n",&local_159);
            error(in_stack_fffffffffffffce8,
                  (string *)
                  CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffce6,
                                           CONCAT15(bVar10,in_stack_fffffffffffffce0))));
            std::operator<<((ostream *)&std::cerr,local_138);
            std::__cxx11::string::~string(local_138);
            std::__cxx11::string::~string(local_158);
            std::allocator<char>::~allocator((allocator<char> *)&local_159);
            local_1 = 0;
            goto LAB_00371310;
          }
          network_pimpl::getAddress_abi_cxx11_(in_stack_fffffffffffffc48);
          pzVar5 = *(zsock_t **)(in_RDI + 0x58);
          std::operator+(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
          network_pimpl::getPort(*(network_pimpl **)(in_RDI + 0x28));
          std::__cxx11::to_string(iVar4);
          std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
          uVar7 = std::__cxx11::string::c_str();
          iVar4 = zsock_bind(pzVar5,"%s",uVar7);
          std::__cxx11::string::~string(local_1a8);
          std::__cxx11::string::~string(local_1c8);
          std::__cxx11::string::~string(local_208);
          std::__cxx11::string::~string(local_1e8);
          local_184 = iVar4;
          if (-1 < iVar4) {
            network_pimpl::setHardware_address
                      (in_stack_fffffffffffffc50,(string *)in_stack_fffffffffffffc48);
            network_pimpl::setHardware_port(*(network_pimpl **)(in_RDI + 0x28),local_184);
            pcVar6 = zsock_endpoint(*(zsock_t **)(in_RDI + 0x58));
            paVar9 = &local_271;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_270,pcVar6,paVar9);
            network_pimpl::setHardware_endpoint
                      (in_stack_fffffffffffffc50,(string *)in_stack_fffffffffffffc48);
            std::__cxx11::string::~string(local_270);
            std::allocator<char>::~allocator((allocator<char> *)&local_271);
            std::lock_guard<std::mutex>::lock_guard
                      ((lock_guard<std::mutex> *)in_stack_fffffffffffffc50,
                       (mutex_type *)in_stack_fffffffffffffc48);
            zstr_send(*(void **)(in_RDI + 0x40),"addhsock");
            std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x371013);
          }
          else {
            paVar9 = &local_249;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_248,"Error initializing Trodes hardware socket\n",paVar9);
            error(in_stack_fffffffffffffce8,
                  (string *)
                  CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffce6,
                                           CONCAT15(bVar10,in_stack_fffffffffffffce0))));
            std::operator<<((ostream *)&std::cerr,local_228);
            std::__cxx11::string::~string(local_228);
            std::__cxx11::string::~string(local_248);
            std::allocator<char>::~allocator((allocator<char> *)&local_249);
            local_1 = 0;
          }
          local_250 = (uint)(-1 >= iVar4);
          std::__cxx11::string::~string(local_180);
          if (local_250 != 0) goto LAB_00371310;
        }
        else {
          pzVar5 = zsock_new_checked(3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
                                     ,0x4e1);
          *(zsock_t **)(in_RDI + 0x58) = pzVar5;
          self = *(void **)(in_RDI + 0x58);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          zsock_set_identity(self,pcVar6);
          pzVar5 = *(zsock_t **)(in_RDI + 0x58);
          network_pimpl::getHardware_endpoint_abi_cxx11_(in_stack_fffffffffffffc48);
          uVar7 = std::__cxx11::string::c_str();
          zsock_connect(pzVar5,"%s",uVar7);
          std::__cxx11::string::~string(local_2a0);
          if (*(long *)(in_RDI + 0x58) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_2e0,"Error creating hardware router socket at ",&local_2e1);
            error(in_stack_fffffffffffffce8,
                  (string *)
                  CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffce6,
                                           CONCAT15(bVar10,in_stack_fffffffffffffce0))));
            poVar8 = std::operator<<((ostream *)&std::cerr,local_2c0);
            network_pimpl::getHardware_endpoint_abi_cxx11_(in_stack_fffffffffffffc48);
            poVar8 = std::operator<<(poVar8,local_308);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string(local_308);
            std::__cxx11::string::~string(local_2c0);
            std::__cxx11::string::~string(local_2e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
            local_1 = 0;
            goto LAB_00371310;
          }
        }
        local_1 = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c8,"Hardware socket not initialized by Trodes yet\n",&local_c9);
      error(in_stack_fffffffffffffce8,
            (string *)
            CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffce6,
                                     CONCAT15(bVar10,in_stack_fffffffffffffce0))));
      std::operator<<((ostream *)&std::cerr,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      local_1 = 0;
    }
  }
  else {
    this_00 = (MlmWrap *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),"Hardware socket already initialized!\n",
               (allocator *)this_00);
    error(this_00,(string *)
                  CONCAT17(in_stack_fffffffffffffce7,
                           CONCAT16(in_stack_fffffffffffffce6,
                                    CONCAT15(in_stack_fffffffffffffce5,in_stack_fffffffffffffce0))))
    ;
    std::operator<<((ostream *)&std::cerr,local_30);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    local_1 = 0;
  }
LAB_00371310:
  return (bool)(local_1 & 1);
}

Assistant:

bool MlmWrap::init_hardware_connection(){
    if(hardwaresock != NULL && zsock_is(hardwaresock)){
        std::cerr << error("Hardware socket already initialized!\n");
        return false;
    }

    if(state->getHardware_endpoint().empty() && id != TRODES_NETWORK_ID){
        std::cerr << error("Hardware socket not initialized by Trodes yet\n");
        return false;
    }

    if(id == TEMP_NETWORK_ID || id == BROKER_NETWORK_ID){
        std::cerr << error("Error initializing hardware connection. ") << id << " cannot speak to hardware!\n";
        return false;
    }

    if(id == TRODES_NETWORK_ID){
    //1. create socket
        hardwaresock = zsock_new(ZMQ_ROUTER);
        if(hardwaresock == NULL){
            std::cerr << error("Error creating hardware router socket\n");
            return false;
        }
        std::string h_address = state->getAddress();
        int h_port = zsock_bind(hardwaresock, "%s", std::string(h_address + ":*[" +
                       std::to_string(state->getPort()+1) + "-]").c_str());
        if(h_port < 0){
            std::cerr << error("Error initializing Trodes hardware socket\n");
            return false;
        }

    //2. update state
        state->setHardware_address(h_address);
        state->setHardware_port(h_port);
        state->setHardware_endpoint(zsock_endpoint(hardwaresock));

    //3. add hardwaresock to zloop so that it can be handled automatically
        std::lock_guard<std::mutex> lock(actormutex);
        zstr_send(actor, addhsock);
    }
    else{
    //1. use the trodes hardware router socket address and connect (get from hardware state)
        hardwaresock = zsock_new(ZMQ_REQ);
        zsock_set_identity(hardwaresock, id.c_str());
        zsock_connect(hardwaresock, "%s", state->getHardware_endpoint().c_str());
        if(hardwaresock == NULL){
            std::cerr << error("Error creating hardware router socket at ") << state->getHardware_endpoint() << "\n";
            return false;
        }
    }
    return true;
}